

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexSeparableKernel.h
# Opt level: O0

void __thiscall Ptex::v2_4::PtexSeparableKernel::upresU(PtexSeparableKernel *this)

{
  float fVar1;
  float *pfVar2;
  int i;
  float *dst;
  float *src;
  PtexSeparableKernel *this_local;
  
  src = this->ku + this->uw;
  pfVar2 = this->ku + (this->uw << 1);
  for (i = this->uw; src = src + -1, dst = pfVar2 + -2, 0 < i; i = i + -1) {
    fVar1 = *src;
    pfVar2[-1] = fVar1 / 2.0;
    *dst = fVar1 / 2.0;
    pfVar2 = dst;
  }
  this->uw = this->uw << 1;
  this->u = this->u << 1;
  (this->res).ulog2 = (this->res).ulog2 + '\x01';
  return;
}

Assistant:

void upresU()
    {
        float* src = ku + uw-1;
        float* dst = ku + uw*2-2;
        for (int i = uw; i > 0; i--) {
            dst[0] = dst[1] = *src-- / 2;
            dst -=2;
        }
        uw *= 2;
        u *= 2;
        res.ulog2++;
    }